

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O3

bool __thiscall
FIX::double_conversion::RoundWeedCounted
          (double_conversion *this,Vector<char> buffer,int length,uint64_t rest,uint64_t ten_kappa,
          uint64_t unit,int *kappa)

{
  double_conversion dVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  double_conversion *pdVar7;
  
  uVar3 = CONCAT44(in_register_0000000c,length);
  if (rest <= uVar3) {
    __assert_fail("rest < ten_kappa",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                  ,0xbb,
                  "bool FIX::double_conversion::RoundWeedCounted(Vector<char>, int, uint64_t, uint64_t, uint64_t, int *)"
                 );
  }
  if (ten_kappa < rest - ten_kappa && ten_kappa < rest) {
    if ((uVar3 < rest - uVar3) && (ten_kappa * 2 <= rest + uVar3 * -2)) {
      return true;
    }
    uVar4 = uVar3 - ten_kappa;
    if ((ten_kappa <= uVar3 && uVar4 != 0) && (rest - uVar4 <= uVar4)) {
      iVar5 = buffer.length_;
      if ((iVar5 < 1) || ((int)buffer.start_ < iVar5)) {
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xcc,
                      "T &FIX::double_conversion::Vector<char>::operator[](int) const [T = char]");
      }
      uVar2 = iVar5 - 1;
      dVar1 = (double_conversion)((char)this[uVar2] + '\x01');
      this[uVar2] = dVar1;
      if (uVar2 != 0) {
        uVar6 = 0;
        pdVar7 = this;
        do {
          if (dVar1 != (double_conversion)0x3a) break;
          pdVar7[uVar2] = (double_conversion)0x30;
          dVar1 = (double_conversion)((char)pdVar7[iVar5 - 2U] + '\x01');
          pdVar7[iVar5 - 2U] = dVar1;
          uVar6 = uVar6 + 1;
          pdVar7 = pdVar7 + -1;
        } while (uVar2 != uVar6);
      }
      if (*this != (double_conversion)0x3a) {
        return true;
      }
      *this = (double_conversion)0x31;
      *(int *)unit = *(int *)unit + 1;
      return true;
    }
  }
  return false;
}

Assistant:

static bool RoundWeedCounted(Vector<char> buffer,
                             int length,
                             uint64_t rest,
                             uint64_t ten_kappa,
                             uint64_t unit,
                             int* kappa) {
  ASSERT(rest < ten_kappa);
  // The following tests are done in a specific order to avoid overflows. They
  // will work correctly with any uint64 values of rest < ten_kappa and unit.
  //
  // If the unit is too big, then we don't know which way to round. For example
  // a unit of 50 means that the real number lies within rest +/- 50. If
  // 10^kappa == 40 then there is no way to tell which way to round.
  if (unit >= ten_kappa) return false;
  // Even if unit is just half the size of 10^kappa we are already completely
  // lost. (And after the previous test we know that the expression will not
  // over/underflow.)
  if (ten_kappa - unit <= unit) return false;
  // If 2 * (rest + unit) <= 10^kappa we can safely round down.
  if ((ten_kappa - rest > rest) && (ten_kappa - 2 * rest >= 2 * unit)) {
    return true;
  }
  // If 2 * (rest - unit) >= 10^kappa, then we can safely round up.
  if ((rest > unit) && (ten_kappa - (rest - unit) <= (rest - unit))) {
    // Increment the last digit recursively until we find a non '9' digit.
    buffer[length - 1]++;
    for (int i = length - 1; i > 0; --i) {
      if (buffer[i] != '0' + 10) break;
      buffer[i] = '0';
      buffer[i - 1]++;
    }
    // If the first digit is now '0'+ 10 we had a buffer with all '9's. With the
    // exception of the first digit all digits are now '0'. Simply switch the
    // first digit to '1' and adjust the kappa. Example: "99" becomes "10" and
    // the power (the kappa) is increased.
    if (buffer[0] == '0' + 10) {
      buffer[0] = '1';
      (*kappa) += 1;
    }
    return true;
  }
  return false;
}